

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

bool __thiscall
Inline::InlineCallTarget
          (Inline *this,Instr *callInstr,FunctionJITTimeInfo *inlinerData,
          FunctionJITTimeInfo **pInlineeData,FunctionJITTimeInfo *callFuncInfo,
          StackSym *symCallerThis,Instr **returnInstr,uint recursiveInlineDepth,
          bool isCallInstanceFunction)

{
  code *pcVar1;
  bool bVar2;
  _E _Var3;
  uint localFuncId;
  Opnd *pOVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  RegOpnd *this_00;
  StackSym *pSVar7;
  Instr *byteCodeArgOutCapture;
  Instr *explicitThisArgOut;
  Instr *funcObjCheckInsertInstr;
  bool safeThis;
  StackSym *pSStack_98;
  bool originalCallTargetOpndIsJITOpt;
  StackSym *originalCallTargetStackSym;
  BuiltinFunction builtInId;
  ValueType returnType;
  OpCode builtInInlineOpCode;
  bool targetIsCallback;
  Instr *pIStack_88;
  CallApplyTargetSourceType targetType;
  Instr *callbackDefInstr;
  FunctionJITTimeInfo *pFStack_78;
  InlineCacheIndex inlineCacheIndex;
  FunctionJITTimeInfo *inlineeData;
  Instr *callTargetLdInstr;
  Instr *callLdInstr;
  StackSym *pSStack_58;
  bool isCallInstanceFunction_local;
  StackSym *symCallerThis_local;
  FunctionJITTimeInfo *callFuncInfo_local;
  FunctionJITTimeInfo **pInlineeData_local;
  FunctionJITTimeInfo *inlinerData_local;
  Instr *callInstr_local;
  Inline *this_local;
  
  callLdInstr._7_1_ = isCallInstanceFunction;
  callTargetLdInstr = (Instr *)0x0;
  inlineeData = (FunctionJITTimeInfo *)0x0;
  pSStack_58 = symCallerThis;
  symCallerThis_local = (StackSym *)callFuncInfo;
  callFuncInfo_local = (FunctionJITTimeInfo *)pInlineeData;
  pInlineeData_local = (FunctionJITTimeInfo **)inlinerData;
  inlinerData_local = (FunctionJITTimeInfo *)callInstr;
  callInstr_local = (Instr *)this;
  bVar2 = TryGetCallApplyAndTargetLdInstrs(this,callInstr,&callTargetLdInstr,(Instr **)&inlineeData)
  ;
  if (bVar2) {
    pFStack_78 = (FunctionJITTimeInfo *)0x0;
    callbackDefInstr._4_4_ = 0xffffffff;
    pIStack_88 = (Instr *)0x0;
    originalCallTargetStackSym._7_1_ = None;
    bVar2 = TryGetCallApplyInlineeData
                      (this,(FunctionJITTimeInfo *)pInlineeData_local,(Instr *)inlinerData_local,
                       callTargetLdInstr,(Instr *)inlineeData,&stack0xffffffffffffff88,
                       (InlineCacheIndex *)((long)&callbackDefInstr + 4),&stack0xffffffffffffff78,
                       (bool)(callLdInstr._7_1_ & 1),
                       (CallApplyTargetSourceType *)((long)&originalCallTargetStackSym + 7));
    if (bVar2) {
      bVar2 = SkipCallApplyScriptTargetInlining_Shared
                        (this,(Instr *)inlinerData_local,(FunctionJITTimeInfo *)pInlineeData_local,
                         pFStack_78,false,true);
      if (bVar2) {
        *(FunctionJITTimeInfo **)&callFuncInfo_local->m_data = pFStack_78;
        this_local._7_1_ = false;
      }
      else {
        originalCallTargetStackSym._6_1_ = pIStack_88 != (Instr *)0x0;
        bVar2 = FunctionJITTimeInfo::HasBody(pFStack_78);
        if (bVar2) {
          pOVar4 = IR::Instr::GetSrc1((Instr *)inlinerData_local);
          pSStack_98 = IR::Opnd::GetStackSym(pOVar4);
          pOVar4 = IR::Instr::GetSrc1((Instr *)inlinerData_local);
          funcObjCheckInsertInstr._7_1_ = IR::Opnd::GetIsJITOptimizedReg(pOVar4);
          funcObjCheckInsertInstr._6_1_ = 0;
          explicitThisArgOut =
               TryGetFixedMethodsForBuiltInAndTarget
                         (this,(Instr *)inlinerData_local,(FunctionJITTimeInfo *)pInlineeData_local,
                          pFStack_78,(FunctionJITTimeInfo *)symCallerThis_local,callTargetLdInstr,
                          (Instr *)inlineeData,(bool *)((long)&funcObjCheckInsertInstr + 6),false,
                          (bool)(originalCallTargetStackSym._6_1_ & 1));
          if (explicitThisArgOut == (Instr *)0x0) {
            this_local._7_1_ = false;
          }
          else {
            byteCodeArgOutCapture = (Instr *)0x0;
            AdjustArgoutsForCallTargetInlining
                      (this,(Instr *)inlinerData_local,&byteCodeArgOutCapture,
                       (bool)(callLdInstr._7_1_ & 1));
            if (byteCodeArgOutCapture == (Instr *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                 ,0xd5d,"(explicitThisArgOut)","explicitThisArgOut");
              if (!bVar2) {
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
              *puVar5 = 0;
            }
            if ((funcObjCheckInsertInstr._6_1_ & 1) != 0) {
              pIVar6 = IR::Instr::GetBytecodeArgOutCapture(byteCodeArgOutCapture);
              pOVar4 = IR::Instr::GetSrc1(pIVar6);
              bVar2 = IR::Opnd::IsRegOpnd(pOVar4);
              if (!bVar2) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar5 = 1;
                bVar2 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                                   ,0xd62,"(byteCodeArgOutCapture->GetSrc1()->IsRegOpnd())",
                                   "byteCodeArgOutCapture->GetSrc1()->IsRegOpnd()");
                if (!bVar2) {
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
                *puVar5 = 0;
              }
              pOVar4 = IR::Instr::GetSrc1(pIVar6);
              this_00 = IR::Opnd::AsRegOpnd(pOVar4);
              pSVar7 = IR::Opnd::GetStackSym(&this_00->super_Opnd);
              if (pSVar7 != pSStack_58) {
                funcObjCheckInsertInstr._6_1_ = 0;
              }
            }
            pIVar6 = InlineCallApplyTarget_Shared
                               (this,(Instr *)inlinerData_local,
                                (bool)(funcObjCheckInsertInstr._7_1_ & 1),pSStack_98,pFStack_78,
                                callbackDefInstr._4_4_,(bool)(funcObjCheckInsertInstr._6_1_ & 1),
                                false,originalCallTargetStackSym._7_1_,pIStack_88,
                                recursiveInlineDepth,explicitThisArgOut);
            *returnInstr = pIVar6;
            this_local._7_1_ = true;
          }
        }
        else if ((originalCallTargetStackSym._6_1_ & 1) == 0) {
          ValueType::ValueType((ValueType *)((long)&originalCallTargetStackSym + 2));
          InliningDecider::GetBuiltInInfo
                    (pFStack_78,(OpCode *)((long)&originalCallTargetStackSym + 4),
                     (ValueType *)((long)&originalCallTargetStackSym + 2));
          localFuncId = FunctionJITTimeInfo::GetLocalFunctionId(pFStack_78);
          originalCallTargetStackSym._1_1_ =
               Js::JavascriptLibrary::GetBuiltInForFuncInfo(localFuncId);
          _Var3 = Js::BuiltinFunction::operator_cast_to__E
                            ((BuiltinFunction *)((long)&originalCallTargetStackSym + 1));
          if (2 < _Var3 - 0x3c) {
            originalCallTargetStackSym._0_1_ = originalCallTargetStackSym._1_1_;
            bVar2 = CanInlineBuiltInFunction
                              (this,(Instr *)inlinerData_local,pFStack_78,
                               originalCallTargetStackSym._4_2_,
                               (FunctionJITTimeInfo *)pInlineeData_local,
                               originalCallTargetStackSym._1_1_,true);
            if (bVar2) {
              bVar2 = InlineCallBuiltInTarget
                                (this,(Instr *)inlinerData_local,
                                 (FunctionJITTimeInfo *)pInlineeData_local,pFStack_78,
                                 (FunctionJITTimeInfo *)symCallerThis_local,(Instr *)inlineeData,
                                 originalCallTargetStackSym._4_2_,pSStack_58,recursiveInlineDepth,
                                 (bool)(callLdInstr._7_1_ & 1),returnInstr);
              return bVar2;
            }
          }
          this_local._7_1_ = false;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
Inline::InlineCallTarget(IR::Instr *callInstr, const FunctionJITTimeInfo* inlinerData, const FunctionJITTimeInfo** pInlineeData, const FunctionJITTimeInfo *callFuncInfo,
                            const StackSym *symCallerThis, IR::Instr ** returnInstr, uint recursiveInlineDepth, bool isCallInstanceFunction)
{
    IR::Instr* callLdInstr = nullptr;
    IR::Instr* callTargetLdInstr = nullptr;
    if (!TryGetCallApplyAndTargetLdInstrs(callInstr, &callLdInstr, &callTargetLdInstr))
    {
        return false;
    }

    const FunctionJITTimeInfo * inlineeData = nullptr;
    Js::InlineCacheIndex inlineCacheIndex = Js::Constants::NoInlineCacheIndex;
    IR::Instr * callbackDefInstr = nullptr;
    CallApplyTargetSourceType targetType = CallApplyTargetSourceType::None;
    if (!TryGetCallApplyInlineeData(inlinerData, callInstr, callLdInstr, callTargetLdInstr, &inlineeData, &inlineCacheIndex, &callbackDefInstr, isCallInstanceFunction, &targetType))
    {
        return false;
    }

    if (SkipCallApplyScriptTargetInlining_Shared(callInstr, inlinerData, inlineeData, /*isApplyTarget*/ false, /*isCallTarget*/ true))
    {
        *pInlineeData = inlineeData;
        return false;
    }

    const bool targetIsCallback = callbackDefInstr != nullptr;

    if (!inlineeData->HasBody())
    {
        if (targetIsCallback)
        {
            return false;
        }

        Js::OpCode builtInInlineOpCode;
        ValueType returnType;
        InliningDecider::GetBuiltInInfo(inlineeData, &builtInInlineOpCode, &returnType);
        Js::BuiltinFunction builtInId = Js::JavascriptLibrary::GetBuiltInForFuncInfo(inlineeData->GetLocalFunctionId());
        switch (builtInId)
        {
        default:
        {
            if (CanInlineBuiltInFunction(callInstr, inlineeData, builtInInlineOpCode, inlinerData, builtInId, true))
            {
                return InlineCallBuiltInTarget(callInstr, inlinerData, inlineeData, callFuncInfo, callTargetLdInstr, builtInInlineOpCode, symCallerThis, recursiveInlineDepth, isCallInstanceFunction, returnInstr);
            }
        }
        case Js::BuiltinFunction::JavascriptFunction_Apply:
        case Js::BuiltinFunction::JavascriptFunction_Call:
        case Js::BuiltinFunction::EngineInterfaceObject_CallInstanceFunction:
            return false;
        }
    }

    StackSym* originalCallTargetStackSym = callInstr->GetSrc1()->GetStackSym();
    bool originalCallTargetOpndIsJITOpt = callInstr->GetSrc1()->GetIsJITOptimizedReg();
    bool safeThis = false;

    IR::Instr * funcObjCheckInsertInstr = TryGetFixedMethodsForBuiltInAndTarget(callInstr, inlinerData, inlineeData, callFuncInfo, callLdInstr, callTargetLdInstr, safeThis, /*isApplyTarget*/ false, targetIsCallback);
    if (!funcObjCheckInsertInstr)
    {
        return false;
    }

    IR::Instr * explicitThisArgOut = nullptr;
    AdjustArgoutsForCallTargetInlining(callInstr, &explicitThisArgOut, isCallInstanceFunction);
    Assert(explicitThisArgOut);

    if (safeThis)
    {
        IR::Instr * byteCodeArgOutCapture = explicitThisArgOut->GetBytecodeArgOutCapture();
        Assert(byteCodeArgOutCapture->GetSrc1()->IsRegOpnd());

        if (byteCodeArgOutCapture->GetSrc1()->AsRegOpnd()->GetStackSym() != symCallerThis)
        {
            safeThis = false;
        }
    }

    *returnInstr = InlineCallApplyTarget_Shared(callInstr, originalCallTargetOpndIsJITOpt, originalCallTargetStackSym, inlineeData, inlineCacheIndex,
        safeThis, /*isApplyTarget*/ false, targetType, callbackDefInstr, recursiveInlineDepth, funcObjCheckInsertInstr);

    return true;
}